

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primeextractor.cpp
# Opt level: O2

void __thiscall PrimeExtractor::PrimeExtractor(PrimeExtractor *this,long stop)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  long i;
  ulong __n;
  double dVar1;
  reference rVar2;
  
  (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this_00 = &this->primeCand;
  this->stop = stop;
  std::vector<bool,_std::allocator<bool>_>::resize(this_00,stop / 2 + 2,false);
  dVar1 = (double)stop;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar1 = ceil(dVar1);
  this->stopSqrt = (long)dVar1;
  for (__n = 0; __n < (ulong)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      ((long)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      (long)(this->primeCand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      __n = __n + 1) {
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n);
    *rVar2._M_p = *rVar2._M_p | rVar2._M_mask;
  }
  rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,1);
  *rVar2._M_p = *rVar2._M_p | rVar2._M_mask;
  return;
}

Assistant:

PrimeExtractor::PrimeExtractor(long stop)
{
  /**
   * The internal data structure consists of a vector of booleans.
   * Given a stop count indicating running until reaching this stop. The binary
   * vector size is just half of the stop count - since half of the numbers are
   * even and therefore not prime. So this leads considerung the iterations to
   * the example tables below. Under the title iterateVector are
   * - index within the vector
   * - value of that index
   * natural stands for the number represended by this index.
   * 
   * Init:
   * iterateVector  natural
   *  0    false        1
   *  1    true         3
   *  2    true         5
   *  3    true         7
   *  4    true         9
   *  5    true        11 
   *  6    true        13
   *  7    true        15
   *  8    true        17
   *  9    true        19
   * 10    true        21
   * 11    true        23
   * 12    true        25
   *
   * First interation:
   * findNextStep returns 1 * 2 + 1 = 3
   * iterateVector  natural
   *  0    false        1
   *  1    true         3
   *  2    true         5
   *  3    true         7
   *  4    false        9
   *  5    true        11 
   *  6    true        13
   *  7    false       15
   *  8    true        17
   *  9    true        19
   * 10    false       21
   * 11    true        23
   * 12    true        25
   *
   * Second iteration:
   * findNextStep returns 2 * 2 +1 = 5
   * iterateVector  natural
   *  0    false        1
   *  1    true         3
   *  2    true         5
   *  3    true         7
   *  4    false        9
   *  5    true        11 
   *  6    true        13
   *  7    false       15
   *  8    true        17
   *  9    true        19
   * 10    false       21
   * 11    true        23
   * 12    false       25
   *
   **/
  long stop_limited = stop / 2 + 1;
  
  this->stop = stop ;
  this->primeCand.resize(stop_limited + 1);
  this->stopSqrt = (long)ceil(sqrt(stop));
  for(long i = 0; i < this->primeCand.size()  ; i++) {
    this->primeCand[i] = true;
  }
  this->primeCand[1] = true;
}